

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BitvecBuiltinTest(int sz,int *aOp)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  u32 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  void *pBuf;
  long lVar9;
  void *pTmpSpace;
  int local_38;
  int op;
  int pc;
  int nx;
  int i;
  int rc;
  uchar *pV;
  Bitvec *pBitvec;
  int *aOp_local;
  int sz_local;
  
  pV = (uchar *)0x0;
  _i = (void *)0x0;
  nx = -1;
  pBitvec = (Bitvec *)aOp;
  aOp_local._4_4_ = sz;
  pV = (uchar *)sqlite3BitvecCreate(sz);
  _i = sqlite3MallocZero((long)((aOp_local._4_4_ + 7) / 8 + 1));
  pBuf = sqlite3_malloc64(0x200);
  if (((pV != (uchar *)0x0) && (_i != (void *)0x0)) && (pBuf != (void *)0x0)) {
    sqlite3BitvecSet((Bitvec *)0x0,1);
    sqlite3BitvecClear((Bitvec *)0x0,1,pBuf);
    local_38 = 0;
    do {
      while( true ) {
        uVar8 = (&pBitvec->iSize)[local_38];
        if (uVar8 == 0) {
          iVar5 = sqlite3BitvecTest((Bitvec *)0x0,0);
          iVar6 = sqlite3BitvecTest((Bitvec *)pV,aOp_local._4_4_ + 1);
          iVar7 = sqlite3BitvecTest((Bitvec *)pV,0);
          uVar4 = sqlite3BitvecSize((Bitvec *)pV);
          nx = iVar5 + iVar6 + iVar7 + (uVar4 - aOp_local._4_4_);
          pc = 1;
          goto LAB_00134ca2;
        }
        if ((uVar8 - 1 < 2) || ((1 < uVar8 - 3 && (uVar8 == 5)))) {
          op = 4;
          pc = (&pBitvec->iSize)[local_38 + 2] - 1;
          (&pBitvec->iSize)[local_38 + 2] =
               (&pBitvec->iSize)[local_38 + 3] + (&pBitvec->iSize)[local_38 + 2];
        }
        else {
          op = 2;
          sqlite3_randomness(4,&pc);
        }
        uVar4 = (&pBitvec->iSize)[local_38 + 1] - 1;
        (&pBitvec->iSize)[local_38 + 1] = uVar4;
        if (0 < (int)uVar4) {
          op = 0;
        }
        local_38 = op + local_38;
        lVar9 = (long)(ulong)(pc & 0x7fffffff) % (long)aOp_local._4_4_;
        pc = (int)lVar9;
        cVar3 = (char)lVar9;
        if ((uVar8 & 1) != 0) break;
        lVar9 = (long)(pc + 1 >> 3);
        *(byte *)((long)_i + lVar9) =
             *(byte *)((long)_i + lVar9) & ((byte)(1 << (cVar3 + 1U & 7)) ^ 0xff);
        sqlite3BitvecClear((Bitvec *)pV,pc + 1,pBuf);
      }
      lVar9 = (long)(pc + 1 >> 3);
      *(byte *)((long)_i + lVar9) = *(byte *)((long)_i + lVar9) | (byte)(1 << (cVar3 + 1U & 7));
    } while ((uVar8 == 5) || (iVar5 = sqlite3BitvecSet((Bitvec *)pV,pc + 1), iVar5 == 0));
  }
LAB_00134d06:
  sqlite3_free(pBuf);
  sqlite3_free(_i);
  sqlite3BitvecDestroy((Bitvec *)pV);
  return nx;
LAB_00134ca2:
  if (aOp_local._4_4_ < pc) goto LAB_00134d06;
  bVar1 = *(byte *)((long)_i + (long)(pc >> 3));
  bVar2 = (byte)pc;
  uVar8 = sqlite3BitvecTest((Bitvec *)pV,pc);
  if ((((uint)bVar1 & 1 << (bVar2 & 7)) != 0) != uVar8) {
    nx = pc;
    goto LAB_00134d06;
  }
  pc = pc + 1;
  goto LAB_00134ca2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecBuiltinTest(int sz, int *aOp){
  Bitvec *pBitvec = 0;
  unsigned char *pV = 0;
  int rc = -1;
  int i, nx, pc, op;
  void *pTmpSpace;

  /* Allocate the Bitvec to be tested and a linear array of
  ** bits to act as the reference */
  pBitvec = sqlite3BitvecCreate( sz );
  pV = sqlite3MallocZero( (sz+7)/8 + 1 );
  pTmpSpace = sqlite3_malloc64(BITVEC_SZ);
  if( pBitvec==0 || pV==0 || pTmpSpace==0  ) goto bitvec_end;

  /* NULL pBitvec tests */
  sqlite3BitvecSet(0, 1);
  sqlite3BitvecClear(0, 1, pTmpSpace);

  /* Run the program */
  pc = 0;
  while( (op = aOp[pc])!=0 ){
    switch( op ){
      case 1:
      case 2:
      case 5: {
        nx = 4;
        i = aOp[pc+2] - 1;
        aOp[pc+2] += aOp[pc+3];
        break;
      }
      case 3:
      case 4: 
      default: {
        nx = 2;
        sqlite3_randomness(sizeof(i), &i);
        break;
      }
    }
    if( (--aOp[pc+1]) > 0 ) nx = 0;
    pc += nx;
    i = (i & 0x7fffffff)%sz;
    if( (op & 1)!=0 ){
      SETBIT(pV, (i+1));
      if( op!=5 ){
        if( sqlite3BitvecSet(pBitvec, i+1) ) goto bitvec_end;
      }
    }else{
      CLEARBIT(pV, (i+1));
      sqlite3BitvecClear(pBitvec, i+1, pTmpSpace);
    }
  }

  /* Test to make sure the linear array exactly matches the
  ** Bitvec object.  Start with the assumption that they do
  ** match (rc==0).  Change rc to non-zero if a discrepancy
  ** is found.
  */
  rc = sqlite3BitvecTest(0,0) + sqlite3BitvecTest(pBitvec, sz+1)
          + sqlite3BitvecTest(pBitvec, 0)
          + (sqlite3BitvecSize(pBitvec) - sz);
  for(i=1; i<=sz; i++){
    if(  (TESTBIT(pV,i))!=sqlite3BitvecTest(pBitvec,i) ){
      rc = i;
      break;
    }
  }

  /* Free allocated structure */
bitvec_end:
  sqlite3_free(pTmpSpace);
  sqlite3_free(pV);
  sqlite3BitvecDestroy(pBitvec);
  return rc;
}